

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O0

bool Kernel::SortHelper::allTopLevelArgsAreSorts(AtomicSort *sort)

{
  bool bVar1;
  uint uVar2;
  TermList *pTVar3;
  Term *in_RDI;
  TermList arg;
  uint i;
  uint local_14;
  
  local_14 = 0;
  do {
    uVar2 = Term::arity(in_RDI);
    if (uVar2 <= local_14) {
      return true;
    }
    pTVar3 = Term::nthArgument(in_RDI,local_14);
    bVar1 = TermList::isVar((TermList *)pTVar3->_content);
    if (!bVar1) {
      TermList::term((TermList *)0x97f1cf);
      bVar1 = Term::isSort((Term *)0x97f1d7);
      if (!bVar1) {
        return false;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool SortHelper::allTopLevelArgsAreSorts(AtomicSort* sort)
{
  for(unsigned i = 0; i < sort->arity(); i++){
    TermList arg = *sort->nthArgument(i);
    if(arg.isVar()){
      continue;
    }
    if(!arg.term()->isSort()){
      return false;
    }
  }
  return true;
}